

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

LaneArray<16> * __thiscall
wasm::getLanes<signed_char,16>(LaneArray<16> *__return_storage_ptr__,wasm *this,Literal *val)

{
  Literal *other;
  reference pvVar1;
  reference this_00;
  size_type __n;
  undefined1 local_58 [8];
  array<unsigned_char,_16UL> bytes;
  
  if (*(long *)(this + 0x10) == 6) {
    _local_58 = Literal::getv128((Literal *)this);
    memset(__return_storage_ptr__,0,0x180);
    other = (Literal *)(bytes._M_elems + 8);
    for (__n = 0; __n != 0x10; __n = __n + 1) {
      pvVar1 = std::array<unsigned_char,_16UL>::at((array<unsigned_char,_16UL> *)local_58,__n);
      bytes._M_elems._8_4_ = SEXT14((char)*pvVar1);
      this_00 = std::array<wasm::Literal,_16UL>::at(__return_storage_ptr__,__n);
      if (this_00 != other) {
        Literal::~Literal(this_00);
        Literal::Literal(this_00,other);
      }
      Literal::~Literal(other);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,
                "LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = signed char, Lanes = 16]"
               );
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}